

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall_fork.c
# Opt level: O1

pid_t metacall_fork_hook(void)

{
  metacall_pre_fork_callback_ptr p_Var1;
  metacall_post_fork_callback_ptr p_Var2;
  int iVar3;
  metacall_pid mVar4;
  _func_void *p_Var5;
  
  p_Var5 = detour_trampoline(detour_fork_handle);
  p_Var2 = metacall_post_fork_callback;
  p_Var1 = metacall_pre_fork_callback;
  log_write_impl_va("metacall",0xe6,"metacall_fork_hook",
                    "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/metacall/source/metacall_fork.c"
                    ,LOG_LEVEL_DEBUG,"MetaCall process forked");
  if (p_Var1 != (metacall_pre_fork_callback_ptr)0x0) {
    log_write_impl_va("metacall",0xeb,"metacall_fork_hook",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/metacall/source/metacall_fork.c"
                      ,LOG_LEVEL_DEBUG,"MetaCall process pre fork callback execution");
    iVar3 = (*p_Var1)((void *)0x0);
    if (iVar3 != 0) {
      log_write_impl_va("metacall",0xf0,"metacall_fork_hook",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/metacall/source/metacall_fork.c"
                        ,LOG_LEVEL_ERROR,"MetaCall invalid detour pre fork callback invocation");
    }
  }
  log_write_impl_va("metacall",0xf4,"metacall_fork_hook",
                    "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/metacall/source/metacall_fork.c"
                    ,LOG_LEVEL_DEBUG,"MetaCall process fork auto destroy");
  metacall_destroy();
  mVar4 = (*p_Var5)();
  log_write_impl_va("metacall",0xfc,"metacall_fork_hook",
                    "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/metacall/source/metacall_fork.c"
                    ,LOG_LEVEL_DEBUG,"MetaCall process fork re-initialize");
  iVar3 = metacall_initialize();
  if (iVar3 != 0) {
    log_write_impl_va("metacall",0x101,"metacall_fork_hook",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/metacall/source/metacall_fork.c"
                      ,LOG_LEVEL_ERROR,"MetaCall fork auto initialization");
  }
  metacall_pre_fork_callback = p_Var1;
  metacall_post_fork_callback = p_Var2;
  if (p_Var2 != (metacall_post_fork_callback_ptr)0x0) {
    log_write_impl_va("metacall",0x10a,"metacall_fork_hook",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/metacall/source/metacall_fork.c"
                      ,LOG_LEVEL_DEBUG,"MetaCall process post fork callback execution");
    iVar3 = (*p_Var2)(mVar4,(void *)0x0);
    if (iVar3 != 0) {
      log_write_impl_va("metacall",0x10f,"metacall_fork_hook",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/metacall/source/metacall_fork.c"
                        ,LOG_LEVEL_ERROR,"MetaCall invalid detour post fork callback invocation");
    }
  }
  return mVar4;
}

Assistant:

pid_t metacall_fork_hook(void)
{
	pid_t (*metacall_fork_trampoline)(void) = (pid_t(*)(void))detour_trampoline(detour_fork_handle);

	metacall_pre_fork_callback_ptr pre_callback = metacall_pre_fork_callback;
	metacall_post_fork_callback_ptr post_callback = metacall_post_fork_callback;

	pid_t pid;

	log_write("metacall", LOG_LEVEL_DEBUG, "MetaCall process forked");

	/* Execute pre fork callback */
	if (pre_callback != NULL)
	{
		log_write("metacall", LOG_LEVEL_DEBUG, "MetaCall process pre fork callback execution");

		/* TODO: Context */
		if (pre_callback(NULL) != 0)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "MetaCall invalid detour pre fork callback invocation");
		}
	}

	log_write("metacall", LOG_LEVEL_DEBUG, "MetaCall process fork auto destroy");

	/* Destroy metacall before the fork */
	metacall_destroy();

	/* Execute the real fork */
	pid = metacall_fork_trampoline();

	log_write("metacall", LOG_LEVEL_DEBUG, "MetaCall process fork re-initialize");

	/* Initialize metacall again */
	if (metacall_initialize() != 0)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "MetaCall fork auto initialization");
	}

	/* Set again the callbacks in the new process */
	metacall_fork(pre_callback, post_callback);

	/* Execute post fork callback */
	if (post_callback != NULL)
	{
		log_write("metacall", LOG_LEVEL_DEBUG, "MetaCall process post fork callback execution");

		/* TODO: Context */
		if (post_callback(pid, NULL) != 0)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "MetaCall invalid detour post fork callback invocation");
		}
	}

	return pid;
}